

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void edition_unittest::TestMutualRecursionB::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  char *failure_msg;
  void *pvVar2;
  int line;
  Arena *arena;
  TestMutualRecursionB *_this;
  TestMutualRecursionB *local_30;
  MessageLite *local_28 [2];
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  local_30 = (TestMutualRecursionB *)to_msg;
  local_28[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<edition_unittest::TestMutualRecursionB_const*,edition_unittest::TestMutualRecursionB*>
                          ((TestMutualRecursionB **)local_28,&local_30,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    line = 0x59fa;
LAB_009bebf7:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/edition_unittest.pb.cc"
               ,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      from_msg_00 = (MessageLite *)from_msg[1]._internal_metadata_.ptr_;
      if (from_msg_00 == (MessageLite *)0x0) {
        failure_msg = "from._impl_.a_ != nullptr";
        line = 0x5a01;
        goto LAB_009bebf7;
      }
      to_msg_00 = *(MessageLite **)((long)&local_30->field_0 + 8);
      if (to_msg_00 == (MessageLite *)0x0) {
        pvVar2 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestMutualRecursionA>
                           (arena,from_msg_00);
        *(void **)((long)&local_30->field_0 + 8) = pvVar2;
      }
      else {
        TestMutualRecursionA::MergeImpl(to_msg_00,from_msg_00);
      }
    }
    if ((uVar1 & 2) != 0) {
      *(undefined4 *)((long)&local_30->field_0 + 0x10) =
           *(undefined4 *)&from_msg[2]._vptr_MessageLite;
    }
  }
  (local_30->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_30->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_30->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void TestMutualRecursionB::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMutualRecursionB*>(&to_msg);
  auto& from = static_cast<const TestMutualRecursionB&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestMutualRecursionB)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.a_ != nullptr);
      if (_this->_impl_.a_ == nullptr) {
        _this->_impl_.a_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.a_);
      } else {
        _this->_impl_.a_->MergeFrom(*from._impl_.a_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_int32_ = from._impl_.optional_int32_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}